

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

uint __thiscall
ON_OutlineFigure::GetFigureCurves
          (ON_OutlineFigure *this,double scale,bool b3d,
          ON_SimpleArray<ON_NurbsCurve_*> *figure_curves)

{
  int iVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  undefined7 extraout_var;
  ON__UINT32 OVar4;
  uint figure_end_dex;
  uint uVar5;
  ON__UINT32 i;
  ON_NurbsCurve *figures_segment;
  ON__UINT32 local_54;
  double local_50;
  int local_48;
  undefined4 local_44;
  ON_SimpleArray<ON_NurbsCurve_*> *local_40;
  ON_NurbsCurve *local_38;
  
  uVar5 = 0;
  local_50 = scale;
  bVar2 = Internal_HasValidEnds(this,false);
  if (bVar2) {
    local_48 = figure_curves->m_count;
    bVar2 = ON_IsValid(local_50);
    if (local_50 <= 0.0 || !bVar2) {
      local_44 = 0;
    }
    else {
      local_44 = (undefined4)CONCAT71(extraout_var,1e-05 < ABS(local_50 + -1.0));
    }
    if ((char)local_44 == '\0') {
      local_50 = 1.0;
    }
    iVar1 = (this->m_points).m_count;
    OVar3 = Internal_EstimateFigureSegmentCount(this);
    if ((ulong)(long)figure_curves->m_capacity < (ulong)OVar3) {
      ON_SimpleArray<ON_NurbsCurve_*>::SetCapacity(figure_curves,(ulong)OVar3);
    }
    figure_end_dex = iVar1 - 1;
    uVar5 = 0;
    local_40 = figure_curves;
    do {
      if (figure_end_dex <= uVar5) break;
      local_54 = 0;
      local_38 = Internal_GetFigureCurve
                           (this,figure_end_dex,uVar5,&local_54,b3d,(ON_NurbsCurve *)0x0);
      OVar3 = local_54;
      if (uVar5 < local_54) {
        OVar4 = OVar3;
        if (local_38 != (ON_NurbsCurve *)0x0) {
          if ((char)local_44 != '\0') {
            ON_Geometry::Scale((ON_Geometry *)local_38,local_50);
          }
          ON_SimpleArray<ON_NurbsCurve_*>::Append(local_40,&local_38);
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                   ,0x55a,"","Failed to parse a figure segment.");
        OVar4 = uVar5;
      }
      bVar2 = uVar5 < OVar3;
      uVar5 = OVar4;
    } while (bVar2);
    uVar5 = local_40->m_count - local_48;
  }
  return uVar5;
}

Assistant:

unsigned int ON_OutlineFigure::GetFigureCurves(
  double scale,
  bool b3d,
  ON_SimpleArray< ON_NurbsCurve* >& figure_curves
) const
{
  if (false == Internal_HasValidEnds(false))
    return 0;

  const unsigned int figure_curves_count0 = figure_curves.UnsignedCount();

  const bool bApplyScale = ON_IsValid(scale) && scale > 0.0 && fabs(scale - 1.0) > 1.0e-5;
  if (false == bApplyScale)
    scale = 1.0;

  const ON__UINT32 figure_start_dex = 0;
  const ON__UINT32 figure_end_dex = m_points.UnsignedCount() - 1;

  //const ON_OutlineFigurePoint figure_start = m_points[figure_start_dex];
  //const ON_OutlineFigurePoint figure_end = m_points[figure_end_dex];
    
  // Find the end of this figure curve and estimate its NURBS curve segment_count.
  //bool bClosedFigure
  //  = ON_OutlineFigurePoint::Type::EndFigureOpen != figure_end.m_point_type
  //  && figure_end.IsOnFigure()
  //  && figure_start.m_point == figure_end.m_point
  //  ;

  // estimate number of NURBS curve segments
  figure_curves.Reserve(Internal_EstimateFigureSegmentCount());

  // get NURBS curve segments
  ON__UINT32 segment_start_dex = figure_start_dex;
  while (segment_start_dex < figure_end_dex)
  {
    ON__UINT32 i = 0;
    ON_NurbsCurve* figures_segment = Internal_GetFigureCurve(
      figure_end_dex,
      segment_start_dex,
      &i,
      b3d,
      nullptr
    );

    if (i <= segment_start_dex)
    {
      ON_ERROR("Failed to parse a figure segment.");
      //bClosedFigure = false;
      break;
    }

    if (nullptr != figures_segment)
    {
      if (bApplyScale)
        figures_segment->Scale(scale);
      figure_curves.Append(figures_segment);
    }
    //else
    //{
    //  bClosedFigure = false;
    //}

    segment_start_dex = i;
  }

  return (figure_curves.UnsignedCount() - figure_curves_count0);
}